

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

void __thiscall
embree::XMLLoader::XMLLoader
          (XMLLoader *this,FileName *fileName,AffineSpace3fa *space,SharedState *state)

{
  FileName *this_00;
  _Rb_tree_header *p_Var1;
  Ref<embree::SceneGraph::Node> *child;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  AffineSpace3fa *xfm;
  int iVar7;
  undefined4 uVar8;
  FILE *pFVar9;
  size_t sVar10;
  long *plVar11;
  GroupNode *this_01;
  TransformNode *this_02;
  runtime_error *this_03;
  size_type *psVar12;
  ulong uVar13;
  long *plVar14;
  Ref<embree::XML> xml;
  long *local_a8;
  undefined1 local_a0 [32];
  string local_80;
  undefined8 local_60;
  AffineSpace3fa *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  FileName::FileName(&this->path);
  this->binFile = (FILE *)0x0;
  this_00 = &this->binFileName;
  FileName::FileName(this_00);
  this->binFileSize = 0;
  this->state = state;
  this->currentNodeID = 0;
  p_Var1 = &(this->id2node)._M_t._M_impl.super__Rb_tree_header;
  (this->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->id2node)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->id2material)._M_t._M_impl.super__Rb_tree_header;
  (this->id2material)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->id2material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->id2material)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->id2material)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  child = &this->root;
  (this->id2material)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->root).ptr = (Node *)0x0;
  FileName::path((FileName *)local_a0,fileName);
  std::__cxx11::string::operator=((string *)this,(string *)local_a0);
  if ((Node *)local_a0._0_8_ != (Node *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x20),".bin","");
  FileName::setExt((FileName *)local_a0,fileName,(string *)(local_a0 + 0x20));
  std::__cxx11::string::operator=((string *)this_00,(string *)local_a0);
  if ((Node *)local_a0._0_8_ != (Node *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  pFVar9 = fopen((this->binFileName).filename._M_dataplus._M_p,"rb");
  this->binFile = (FILE *)pFVar9;
  if (pFVar9 == (FILE *)0x0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x20),".bin","");
    FileName::addExt((FileName *)local_a0,fileName,(string *)(local_a0 + 0x20));
    std::__cxx11::string::operator=((string *)this_00,(string *)local_a0);
    if ((Node *)local_a0._0_8_ != (Node *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    pFVar9 = fopen((this->binFileName).filename._M_dataplus._M_p,"rb");
    this->binFile = (FILE *)pFVar9;
  }
  if ((FILE *)this->binFile != (FILE *)0x0) {
    fseek((FILE *)this->binFile,0,2);
    sVar10 = ftell((FILE *)this->binFile);
    this->binFileSize = sVar10;
    fseek((FILE *)this->binFile,0,0);
  }
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  parseXML((embree *)&local_a8,fileName,(string *)&local_50,true);
  if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  iVar7 = std::__cxx11::string::compare((char *)(local_a8 + 6));
  local_58 = space;
  if (iVar7 == 0) {
    this_01 = (GroupNode *)operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_01,0);
    (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
    local_60 = this_01;
    if (local_a8[0x11] != local_a8[0x10]) {
      uVar13 = 0;
      do {
        loadNode((XMLLoader *)local_a0,(Ref<embree::XML> *)this);
        if ((Node *)local_a0._0_8_ != (Node *)0x0) {
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          ::push_back(&this_01->children,(value_type *)local_a0);
        }
        if ((Node *)local_a0._0_8_ != (Node *)0x0) {
          (**(code **)(*(long *)local_a0._0_8_ + 0x18))();
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)(local_a8[0x11] - local_a8[0x10] >> 3));
    }
    uVar6 = local_60;
    (**(code **)(*(long *)local_60 + 0x10))(local_60);
    if (child->ptr != (Node *)0x0) {
      (*(child->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    child->ptr = (Node *)uVar6;
    plVar11 = (long *)(**(code **)(*(long *)uVar6 + 0x18))(uVar6);
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)(local_a8 + 6));
    if (iVar7 != 0) {
      this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_((string *)(local_a0 + 0x20),(ParseLocation *)(local_a8 + 2));
      plVar11 = (long *)std::__cxx11::string::append(local_a0 + 0x20);
      local_a0._0_8_ = *plVar11;
      psVar12 = (size_type *)(plVar11 + 2);
      if ((size_type *)local_a0._0_8_ == psVar12) {
        local_a0._16_8_ = *psVar12;
        local_a0._24_8_ = plVar11[3];
        local_a0._0_8_ = local_a0 + 0x10;
      }
      else {
        local_a0._16_8_ = *psVar12;
      }
      local_a0._8_8_ = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::runtime_error::runtime_error(this_03,(string *)local_a0);
      __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar11 = local_a8;
    if (local_a8[0x11] != local_a8[0x10]) {
      plVar14 = (long *)0x0;
      do {
        loadBGFNode((XMLLoader *)local_a0,(Ref<embree::XML> *)this);
        if (child->ptr != (Node *)0x0) {
          (*(child->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        child->ptr = (Node *)local_a0._0_8_;
        plVar14 = (long *)((long)plVar14 + 1);
        plVar11 = (long *)(local_a8[0x11] - local_a8[0x10] >> 3);
      } while (plVar14 < plVar11);
    }
  }
  xfm = local_58;
  auVar2._4_4_ = -(uint)((local_58->l).vx.field_0.m128[1] == 0.0);
  auVar2._0_4_ = -(uint)((local_58->l).vx.field_0.m128[0] == 1.0);
  auVar2._8_4_ = -(uint)((local_58->l).vx.field_0.m128[2] == 0.0);
  auVar2._12_4_ = -(uint)((local_58->l).vx.field_0.m128[3] == 0.0);
  uVar8 = movmskps((int)plVar11,auVar2);
  if ((~(byte)uVar8 & 7) == 0) {
    auVar3._4_4_ = -(uint)((local_58->l).vy.field_0.m128[1] == 1.0);
    auVar3._0_4_ = -(uint)((local_58->l).vy.field_0.m128[0] == 0.0);
    auVar3._8_4_ = -(uint)((local_58->l).vy.field_0.m128[2] == 0.0);
    auVar3._12_4_ = -(uint)((local_58->l).vy.field_0.m128[3] == 0.0);
    uVar8 = movmskps(CONCAT31((int3)((uint)uVar8 >> 8),~(byte)uVar8),auVar3);
    if ((~(byte)uVar8 & 7) == 0) {
      auVar4._4_4_ = -(uint)((local_58->l).vz.field_0.m128[1] == 0.0);
      auVar4._0_4_ = -(uint)((local_58->l).vz.field_0.m128[0] == 0.0);
      auVar4._8_4_ = -(uint)((local_58->l).vz.field_0.m128[2] == 1.0);
      auVar4._12_4_ = -(uint)((local_58->l).vz.field_0.m128[3] == 0.0);
      uVar8 = movmskps(CONCAT31((int3)((uint)uVar8 >> 8),~(byte)uVar8),auVar4);
      if (((~(byte)uVar8 & 7) == 0) &&
         (auVar5._4_4_ = -(uint)((local_58->p).field_0.m128[1] == 0.0),
         auVar5._0_4_ = -(uint)((local_58->p).field_0.m128[0] == 0.0),
         auVar5._8_4_ = -(uint)((local_58->p).field_0.m128[2] == 0.0),
         auVar5._12_4_ = -(uint)((local_58->p).field_0.m128[3] == 0.0),
         uVar8 = movmskps(CONCAT31((int3)((uint)uVar8 >> 8),~(byte)uVar8),auVar5),
         (~(byte)uVar8 & 7) == 0)) goto LAB_001907ff;
    }
  }
  this_02 = (TransformNode *)alignedMalloc(0xa0,0x10);
  SceneGraph::TransformNode::TransformNode(this_02,xfm,child);
  (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
  if (child->ptr != (Node *)0x0) {
    (*(child->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  child->ptr = (Node *)this_02;
LAB_001907ff:
  if (local_a8 != (long *)0x0) {
    (**(code **)(*local_a8 + 0x18))();
  }
  return;
}

Assistant:

XMLLoader::XMLLoader(const FileName& fileName, const AffineSpace3fa& space, SharedState& state)
    : binFile(nullptr), binFileSize(0), state(state), currentNodeID(0)
  {
    path = fileName.path();
    binFileName = fileName.setExt(".bin");
    binFile = fopen(binFileName.c_str(),"rb");
    if (!binFile) {
      binFileName = fileName.addExt(".bin");
      binFile = fopen(binFileName.c_str(),"rb");
    }
    if (binFile) {
      fseek(binFile, 0L, SEEK_END);
      binFileSize = ftell(binFile);
      fseek(binFile, 0L, SEEK_SET);
    }


    Ref<XML> xml = parseXML(fileName);
    if (xml->name == "scene") 
    {
      Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
      for (size_t i=0; i<xml->size(); i++) { 
        group->add(loadNode(xml->children[i]));
      }
      root = group.cast<SceneGraph::Node>();
    }
    else if (xml->name == "BGFscene") 
    {
      Ref<SceneGraph::Node> last = nullptr;
      for (size_t i=0; i<xml->size(); i++) { 
        root = loadBGFNode(xml->children[i]);
      }
    }
    else 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid scene tag");

    if (space == AffineSpace3fa(one)) 
      return;
    
    root = new SceneGraph::TransformNode(space,root);
  }